

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O0

void CnvExtClose(NewConverter *cnvData)

{
  CnvExtData *extData;
  NewConverter *cnvData_local;
  
  if (cnvData != (NewConverter *)0x0) {
    utm_close((UToolMemory *)cnvData[1].isValid);
    utm_close((UToolMemory *)cnvData[1].addTable);
    utm_close((UToolMemory *)cnvData[1].write);
    utm_close((UToolMemory *)cnvData[2].close);
    utm_close((UToolMemory *)cnvData[2].isValid);
    uprv_free_63(cnvData);
  }
  return;
}

Assistant:

static void
CnvExtClose(NewConverter *cnvData) {
    CnvExtData *extData=(CnvExtData *)cnvData;
    if(extData!=NULL) {
        utm_close(extData->toUTable);
        utm_close(extData->toUUChars);
        utm_close(extData->fromUTableUChars);
        utm_close(extData->fromUTableValues);
        utm_close(extData->fromUBytes);
        uprv_free(extData);
    }
}